

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

string * __thiscall
duckdb::ExtractCollation_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  bool bVar2;
  pointer pEVar3;
  BinderException *this_00;
  LogicalType *type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  allocator local_69;
  string local_68;
  string child_collation;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_01 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)this;
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            (this + 8);
  do {
    if (this_01 == puVar1) {
      return __return_storage_ptr__;
    }
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_01);
    bVar2 = RequiresCollationPropagation(&pEVar3->return_type);
    if (bVar2) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      StringType::GetCollation_abi_cxx11_
                ((string *)&child_collation,(StringType *)&pEVar3->return_type,type);
      if (__return_storage_ptr__->_M_string_length == 0) {
        ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      else if (child_collation._M_string_length != 0) {
        bVar2 = ::std::operator!=(__return_storage_ptr__,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&child_collation);
        if (bVar2) {
          this_00 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_68,"Cannot combine types with different collation!",&local_69)
          ;
          BinderException::BinderException(this_00,&local_68);
          __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      ::std::__cxx11::string::~string((string *)&child_collation);
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

string ExtractCollation(const vector<unique_ptr<Expression>> &children) {
	string collation;
	for (auto &arg : children) {
		if (!RequiresCollationPropagation(arg->return_type)) {
			// not a varchar column
			continue;
		}
		auto child_collation = StringType::GetCollation(arg->return_type);
		if (collation.empty()) {
			collation = child_collation;
		} else if (!child_collation.empty() && collation != child_collation) {
			throw BinderException("Cannot combine types with different collation!");
		}
	}
	return collation;
}